

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  uint64_t uVar483;
  uint64_t uVar484;
  uint64_t uVar485;
  uint64_t uVar486;
  uint64_t uVar487;
  uint64_t uVar488;
  uint64_t uVar489;
  uint64_t uVar490;
  uint64_t uVar491;
  uint64_t uVar492;
  int iVar493;
  ulong uVar494;
  ulong uVar495;
  ulong uVar496;
  ulong uVar497;
  ulong uVar498;
  ulong uVar499;
  ulong uVar500;
  ulong uVar501;
  ulong uVar502;
  ulong uVar503;
  ulong uVar504;
  uint64_t uVar505;
  secp256k1_fe n;
  secp256k1_fe u1;
  secp256k1_fe d;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_198;
  ulong local_170;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  local_88.n[0] = u->n[0];
  local_88.n[1] = u->n[1];
  local_88.n[2] = u->n[2];
  local_88.n[3] = u->n[3];
  local_88.n[4] = u->n[4];
  iVar493 = secp256k1_fe_impl_normalizes_to_zero_var(&local_88);
  if (iVar493 != 0) {
    local_88.n[2] = 0;
    local_88.n[3] = 0;
    local_88.n[0] = 1;
    local_88.n[1] = 0;
    local_88.n[4] = 0;
  }
  uVar497 = t->n[0];
  uVar494 = t->n[1];
  uVar499 = t->n[3];
  uVar500 = uVar497 * 2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar499;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = uVar500;
  uVar496 = t->n[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar496;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uVar494 * 2;
  uVar498 = t->n[4];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar498;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = uVar498;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB168(auVar3 * auVar283,0);
  auVar4 = auVar2 * auVar282 + auVar1 * auVar281 + auVar4 * ZEXT816(0x1000003d10);
  uVar498 = uVar498 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar498;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = uVar497;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar499;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uVar494 * 2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar496;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar496;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SUB168(auVar3 * auVar283,8);
  auVar1 = auVar8 * ZEXT816(0x1000003d10000) +
           auVar5 * auVar284 + auVar7 * auVar286 + auVar6 * auVar285 + (auVar4 >> 0x34);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar497;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uVar497;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar498;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = uVar494;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar499;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar496 * 2;
  auVar2 = auVar11 * auVar289 + auVar10 * auVar288 + (auVar1 >> 0x34);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar5 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar287;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar494;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = uVar500;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar498;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uVar496;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar499;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar499;
  auVar2 = auVar15 * auVar292 + auVar14 * auVar291 + (auVar2 >> 0x34);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar6 = auVar16 * ZEXT816(0x1000003d10) + auVar13 * auVar290 + (auVar5 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar496;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uVar500;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar494;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = uVar494;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar498;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar499;
  auVar2 = auVar19 * auVar295 + (auVar2 >> 0x34);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar2._0_8_;
  auVar3 = auVar20 * ZEXT816(0x1000003d10) + auVar18 * auVar294 + auVar17 * auVar293 +
           (auVar6 >> 0x34);
  auVar7 = auVar3 >> 0x34;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = auVar7._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar2._8_8_;
  auVar457._8_8_ = auVar7._8_8_;
  auVar457._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
  auVar458 = auVar21 * ZEXT816(0x1000003d10000) + auVar457 + auVar458;
  uVar497 = auVar458._0_8_;
  iVar493 = secp256k1_fe_impl_normalizes_to_zero_var(t);
  uVar492 = local_88.n[4];
  uVar491 = local_88.n[3];
  uVar490 = local_88.n[2];
  uVar489 = local_88.n[1];
  uVar488 = local_88.n[0];
  if (iVar493 == 0) {
    local_1c8 = auVar5._0_8_ & 0xfffffffffffff;
    local_170 = auVar6._0_8_ & 0xfffffffffffff;
    local_1d8 = auVar3._0_8_ & 0xfffffffffffff;
    local_1d0 = uVar497 & 0xfffffffffffff;
    local_198 = (auVar458._8_8_ << 0xc | uVar497 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
  }
  else {
    local_1c8 = 1;
    local_170 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_198 = 0;
  }
  uVar497 = local_88.n[0] * 2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_88.n[3];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar497;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_88.n[2];
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_88.n[1] * 2;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_88.n[4];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_88.n[4];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SUB168(auVar24 * auVar298,0);
  auVar3 = auVar23 * auVar297 + auVar22 * auVar296 + auVar25 * ZEXT816(0x1000003d10);
  uVar494 = local_88.n[4] * 2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar494;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_88.n[0];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_88.n[3];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_88.n[1] * 2;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_88.n[2];
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_88.n[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SUB168(auVar24 * auVar298,8);
  auVar1 = auVar29 * ZEXT816(0x1000003d10000) +
           auVar26 * auVar299 + auVar28 * auVar301 + auVar27 * auVar300 + (auVar3 >> 0x34);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_88.n[0];
  auVar302._8_8_ = 0;
  auVar302._0_8_ = local_88.n[0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar494;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = local_88.n[1];
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_88.n[3];
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_88.n[2] * 2;
  auVar2 = auVar32 * auVar304 + auVar31 * auVar303 + (auVar1 >> 0x34);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar4 = auVar33 * ZEXT816(0x1000003d1) + auVar30 * auVar302;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_88.n[1];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = uVar497;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar494;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = local_88.n[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_88.n[3];
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_88.n[3];
  auVar2 = auVar36 * auVar307 + auVar35 * auVar306 + (auVar2 >> 0x34);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar5 = (auVar4 >> 0x34) + auVar37 * ZEXT816(0x1000003d10) + auVar34 * auVar305;
  uVar503 = auVar5._0_8_;
  uVar499 = auVar5._8_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_88.n[2];
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar497;
  auVar451._8_8_ = uVar499 >> 0x34;
  auVar451._0_8_ = uVar499 * 0x1000 | uVar503 >> 0x34;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_88.n[1];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = local_88.n[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar494;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = local_88.n[3];
  auVar2 = auVar40 * auVar310 + (auVar2 >> 0x34);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar2._0_8_;
  auVar451 = auVar41 * ZEXT816(0x1000003d10) + auVar39 * auVar309 + auVar38 * auVar308 + auVar451;
  auVar5 = auVar451 >> 0x34;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = auVar5._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar2._8_8_;
  auVar459._8_8_ = auVar5._8_8_;
  auVar459._0_8_ = auVar3._0_8_ & 0xffffffffffffe;
  auVar460 = auVar42 * ZEXT816(0x1000003d10000) + auVar459 + auVar460;
  uVar500 = auVar460._0_8_;
  uVar497 = auVar4._0_8_ & 0xfffffffffffff;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar497;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = local_88.n[3];
  uVar501 = (auVar460._8_8_ << 0xc | uVar500 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
  uVar503 = uVar503 & 0xfffffffffffff;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar503;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = local_88.n[2];
  uVar504 = auVar451._0_8_ & 0xfffffffffffff;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar504;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = local_88.n[1];
  uVar500 = uVar500 & 0xfffffffffffff;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar500;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = local_88.n[0];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar501;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = local_88.n[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = SUB168(auVar47 * auVar315,0);
  auVar1 = auVar43 * auVar311 + auVar44 * auVar312 + auVar45 * auVar313 + auVar46 * auVar314 +
           auVar48 * ZEXT816(0x1000003d10);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar497;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = local_88.n[4];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar503;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = local_88.n[3];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar504;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = local_88.n[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar500;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = local_88.n[1];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar501;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = local_88.n[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = SUB168(auVar47 * auVar315,8);
  auVar2 = auVar54 * ZEXT816(0x1000003d10000) +
           auVar53 * auVar320 +
           auVar52 * auVar319 + auVar51 * auVar318 + auVar49 * auVar316 + auVar50 * auVar317 +
           (auVar1 >> 0x34);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar497;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = local_88.n[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar503;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = local_88.n[4];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar504;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = local_88.n[3];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar500;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = local_88.n[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar501;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = local_88.n[1];
  auVar3 = auVar59 * auVar325 + auVar58 * auVar324 + auVar57 * auVar323 + auVar56 * auVar322 +
           (auVar2 >> 0x34);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
  auVar4 = auVar55 * auVar321 + auVar60 * ZEXT816(0x1000003d1);
  uVar494 = auVar4._0_8_;
  uVar499 = auVar4._8_8_;
  auVar452._8_8_ = uVar499 >> 0x34;
  auVar452._0_8_ = uVar499 * 0x1000 | uVar494 >> 0x34;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar497;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = local_88.n[1];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar503;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = local_88.n[0];
  uVar494 = uVar494 & 0xfffffffffffff;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar504;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = local_88.n[4];
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar500;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = local_88.n[3];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar501;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = local_88.n[2];
  auVar3 = auVar65 * auVar330 + auVar64 * auVar329 + auVar63 * auVar328 + (auVar3 >> 0x34);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
  auVar452 = auVar66 * ZEXT816(0x1000003d10) + auVar61 * auVar326 + auVar62 * auVar327 + auVar452;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar497;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = local_88.n[2];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar503;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = local_88.n[1];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar504;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = local_88.n[0];
  uVar502 = auVar452._0_8_ & 0xfffffffffffff;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar500;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = local_88.n[4];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar501;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = local_88.n[3];
  auVar3 = auVar71 * auVar335 + auVar70 * auVar334 + (auVar3 >> 0x34);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = auVar3._0_8_;
  auVar4 = auVar72 * ZEXT816(0x1000003d10) +
           auVar69 * auVar333 + auVar67 * auVar331 + auVar68 * auVar332 + (auVar452 >> 0x34);
  auVar5 = auVar4 >> 0x34;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = auVar5._0_8_;
  uVar499 = auVar4._0_8_ & 0xfffffffffffff;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = auVar3._8_8_;
  auVar461._8_8_ = auVar5._8_8_;
  auVar461._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
  auVar462 = auVar73 * ZEXT816(0x1000003d10000) + auVar461 + auVar462;
  uVar496 = auVar462._0_8_;
  uVar498 = (auVar462._8_8_ << 0xc | uVar496 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
  local_d0.n[0] = uVar494 + local_1c8 + 7;
  local_d0.n[1] = uVar502 + local_170;
  local_d0.n[2] = uVar499 + local_1d8;
  uVar496 = uVar496 & 0xfffffffffffff;
  local_d0.n[3] = uVar496 + local_1d0;
  local_d0.n[4] = uVar498 + local_198;
  uVar494 = uVar494 + 7;
  iVar493 = secp256k1_fe_impl_normalizes_to_zero_var(&local_d0);
  if (iVar493 != 0) {
    local_d0.n[4] = local_198 * 4 + uVar498;
    local_198 = local_198 * 4;
    local_d0.n[0] = uVar494 + local_1c8 * 4;
    local_1c8 = local_1c8 << 2;
    local_d0.n[1] = uVar502 + local_170 * 4;
    local_170 = local_170 << 2;
    local_d0.n[2] = uVar499 + local_1d8 * 4;
    local_1d8 = local_1d8 << 2;
    local_d0.n[3] = uVar496 + local_1d0 * 4;
    local_1d0 = local_1d0 << 2;
  }
  uVar487 = local_d0.n[4];
  uVar486 = local_d0.n[3];
  uVar485 = local_d0.n[2];
  uVar484 = local_d0.n[1];
  uVar483 = local_d0.n[0];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar500;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = local_1c8;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar504;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = local_170;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar503;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = local_1d8;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar497;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_1d0;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_198;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar501;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = SUB168(auVar78 * auVar340,0);
  auVar4 = auVar75 * auVar337 + auVar74 * auVar336 + auVar76 * auVar338 + auVar77 * auVar339 +
           auVar79 * ZEXT816(0x1000003d10);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_1c8;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar501;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar500;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = local_170;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar504;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = local_1d8;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar503;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = local_1d0;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar497;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = local_198;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = SUB168(auVar78 * auVar340,8);
  auVar1 = auVar85 * ZEXT816(0x1000003d10000) +
           auVar84 * auVar345 +
           auVar83 * auVar344 + auVar82 * auVar343 + auVar80 * auVar341 + auVar81 * auVar342 +
           (auVar4 >> 0x34);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar497;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = local_1c8;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_170;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar501;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar500;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = local_1d8;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar504;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = local_1d0;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar503;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = local_198;
  auVar2 = auVar90 * auVar350 + auVar89 * auVar349 + auVar88 * auVar348 + auVar87 * auVar347 +
           (auVar1 >> 0x34);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar3 = auVar86 * auVar346 + auVar91 * ZEXT816(0x1000003d1);
  uVar495 = auVar3._0_8_;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = auVar3._8_8_ * 0x1000 | uVar495 >> 0x34;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar503;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = local_1c8;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar497;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = local_170;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_1d8;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar501;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar500;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = local_1d0;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar504;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = local_198;
  auVar2 = auVar96 * auVar355 + auVar95 * auVar354 + auVar94 * auVar353 + (auVar2 >> 0x34);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar463 = auVar97 * ZEXT816(0x1000003d10) + auVar92 * auVar351 + auVar93 * auVar352 + auVar463;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar504;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = local_1c8;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar503;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_170;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar497;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_1d8;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = local_1d0;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar501;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar500;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = local_198;
  auVar2 = auVar102 * auVar360 + auVar101 * auVar359 + (auVar2 >> 0x34);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = auVar2._0_8_;
  auVar3 = auVar103 * ZEXT816(0x1000003d10) +
           auVar100 * auVar358 + auVar99 * auVar357 + auVar98 * auVar356 + (auVar463 >> 0x34);
  auVar5 = auVar3 >> 0x34;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = auVar5._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar2._8_8_;
  auVar464._8_8_ = auVar5._8_8_;
  auVar464._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  auVar465 = auVar104 * ZEXT816(0x1000003d10000) + auVar464 + auVar465;
  uVar501 = auVar465._0_8_;
  uVar497 = local_d0.n[0] * 2;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_d0.n[3];
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar497;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = local_d0.n[2];
  auVar362._8_8_ = 0;
  auVar362._0_8_ = local_d0.n[1] * 2;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = local_d0.n[4];
  auVar363._8_8_ = 0;
  auVar363._0_8_ = local_d0.n[4];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = SUB168(auVar107 * auVar363,0);
  auVar5 = auVar106 * auVar362 + auVar105 * auVar361 + auVar108 * ZEXT816(0x1000003d10);
  uVar500 = local_d0.n[4] * 2;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar500;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = local_d0.n[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_d0.n[3];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = local_d0.n[1] * 2;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_d0.n[2];
  auVar366._8_8_ = 0;
  auVar366._0_8_ = local_d0.n[2];
  auVar112._8_8_ = 0;
  auVar112._0_8_ = SUB168(auVar107 * auVar363,8);
  auVar2 = auVar112 * ZEXT816(0x1000003d10000) +
           auVar109 * auVar364 + auVar111 * auVar366 + auVar110 * auVar365 + (auVar5 >> 0x34);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_d0.n[0];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = local_d0.n[0];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar500;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = local_d0.n[1];
  local_90 = auVar2._0_8_ & 0xffffffffffff;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = local_d0.n[3];
  auVar369._8_8_ = 0;
  auVar369._0_8_ = local_d0.n[2] * 2;
  auVar4 = auVar115 * auVar369 + auVar114 * auVar368 + (auVar2 >> 0x34);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
  auVar2 = auVar116 * ZEXT816(0x1000003d1) + auVar113 * auVar367;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_d0.n[1];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar497;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar500;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = local_d0.n[2];
  local_98 = auVar2._0_8_ & 0xfffffffffffff;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = local_d0.n[3];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = local_d0.n[3];
  auVar4 = auVar119 * auVar372 + auVar118 * auVar371 + (auVar4 >> 0x34);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  auVar6 = auVar120 * ZEXT816(0x1000003d10) + auVar117 * auVar370 + (auVar2 >> 0x34);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_d0.n[2];
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar497;
  local_a0 = auVar6._0_8_ & 0xfffffffffffff;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_d0.n[1];
  auVar374._8_8_ = 0;
  auVar374._0_8_ = local_d0.n[1];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar500;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = local_d0.n[3];
  auVar2 = auVar123 * auVar375 + (auVar4 >> 0x34);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = auVar2._0_8_;
  auVar4 = auVar124 * ZEXT816(0x1000003d10) + auVar122 * auVar374 + auVar121 * auVar373 +
           (auVar6 >> 0x34);
  auVar6 = auVar4 >> 0x34;
  auVar466._8_8_ = auVar6._8_8_;
  auVar466._0_8_ = auVar5._0_8_ & 0xffffffffffffe;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = auVar6._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = auVar2._8_8_;
  auVar467 = auVar125 * ZEXT816(0x1000003d10000) + auVar466 + auVar467;
  uVar500 = auVar467._0_8_;
  local_58.n[0] = (uVar495 & 0xfffffffffffff) * 3;
  local_a8 = auVar467._8_8_ << 0xc | uVar500 >> 0x34;
  local_58.n[1] = (auVar463._0_8_ & 0xfffffffffffff) * 3;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = local_58.n[0];
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar491;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_58.n[1];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar490;
  local_58.n[2] = (auVar3._0_8_ & 0xfffffffffffff) * 3;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_58.n[2];
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar489;
  local_58.n[3] = (uVar501 & 0xfffffffffffff) * 3;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_58.n[3];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar488;
  local_58.n[4] = ((auVar465._8_8_ << 0xc | uVar501 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff)) * 3;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_58.n[4];
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar492;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = SUB168(auVar130 * auVar380,0);
  auVar5 = auVar127 * auVar377 + auVar126 * auVar376 + auVar128 * auVar378 + auVar129 * auVar379 +
           auVar131 * ZEXT816(0x1000003d10);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_58.n[0];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar492;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_58.n[1];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar491;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_58.n[2];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar490;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_58.n[3];
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar489;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = local_58.n[4];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar488;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = SUB168(auVar130 * auVar380,8);
  auVar1 = auVar137 * ZEXT816(0x1000003d10000) +
           auVar136 * auVar385 +
           auVar135 * auVar384 + auVar134 * auVar383 + auVar133 * auVar382 + auVar132 * auVar381 +
           (auVar5 >> 0x34);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_58.n[0];
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar488;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_58.n[1];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar492;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_58.n[2];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar491;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_58.n[3];
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar490;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_58.n[4];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar489;
  auVar2 = auVar142 * auVar390 + auVar140 * auVar388 + auVar139 * auVar387 + auVar141 * auVar389 +
           (auVar1 >> 0x34);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
  auVar3 = auVar138 * auVar386 + auVar143 * ZEXT816(0x1000003d1);
  uVar497 = auVar3._0_8_;
  uVar501 = auVar3._8_8_;
  auVar453._8_8_ = uVar501 >> 0x34;
  auVar453._0_8_ = uVar501 * 0x1000 | uVar497 >> 0x34;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_58.n[0];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar489;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_58.n[1];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar488;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_58.n[2];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar492;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_58.n[3];
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar491;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_58.n[4];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar490;
  auVar2 = auVar148 * auVar395 + auVar147 * auVar394 + auVar146 * auVar393 + (auVar2 >> 0x34);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
  auVar453 = auVar149 * ZEXT816(0x1000003d10) + auVar144 * auVar391 + auVar145 * auVar392 + auVar453
  ;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = local_58.n[0];
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar490;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = local_58.n[1];
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar489;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_58.n[2];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar488;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = local_58.n[3];
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar492;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_58.n[4];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar491;
  auVar2 = auVar154 * auVar400 + auVar153 * auVar399 + (auVar2 >> 0x34);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = auVar2._0_8_;
  auVar3 = auVar155 * ZEXT816(0x1000003d10) +
           auVar150 * auVar396 + auVar151 * auVar397 + auVar152 * auVar398 + (auVar453 >> 0x34);
  auVar6 = auVar3 >> 0x34;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = auVar6._0_8_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = auVar2._8_8_;
  auVar468._8_8_ = auVar6._8_8_;
  auVar468._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
  auVar469 = auVar156 * ZEXT816(0x1000003d10000) + auVar468 + auVar469;
  uVar501 = auVar469._0_8_;
  local_f8.n[0] = ((uVar497 & 0xfffffffffffff) - local_98) + 0x3ffffbfffff0bc;
  local_f8.n[1] = ((auVar453._0_8_ & 0xfffffffffffff) - local_a0) + 0x3ffffffffffffc;
  local_f8.n[2] =
       ((auVar3._0_8_ & 0xfffffffffffff) - (auVar4._0_8_ & 0xfffffffffffff)) + 0x3ffffffffffffc;
  local_f8.n[3] = ((uVar501 & 0xfffffffffffff) - (uVar500 & 0xfffffffffffff)) + 0x3ffffffffffffc;
  local_f8.n[4] =
       (((auVar469._8_8_ << 0xc | uVar501 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff)) -
       (local_a8 + local_90)) + 0x3fffffffffffc;
  iVar493 = secp256k1_ge_x_frac_on_curve_var(&local_f8,&local_58);
  if (iVar493 == 0) {
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_1d0;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = local_1d8;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_170;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = local_1c8;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_198;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = SUB168(auVar161 * ZEXT816(0x851695d49a83),0);
    auVar1 = auVar162 * ZEXT816(0x1000003d10) +
             auVar159 * ZEXT816(0x3cbcb16630fb6) + auVar160 * ZEXT816(0xf8ef919bb8615) +
             auVar158 * ZEXT816(0x8aed0a766a3ec) + auVar157 * ZEXT816(0x693d68e6afa40);
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_198;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = local_1d0;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_1d8;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_170;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = local_1c8;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = SUB168(auVar161 * ZEXT816(0x851695d49a83),8);
    auVar2 = auVar168 * ZEXT816(0x1000003d10000) +
             auVar164 * ZEXT816(0x8aed0a766a3ec) +
             auVar165 * ZEXT816(0x3cbcb16630fb6) +
             auVar167 * ZEXT816(0x851695d49a83) + auVar166 * ZEXT816(0xf8ef919bb8615) +
             auVar163 * ZEXT816(0x693d68e6afa40) + (auVar1 >> 0x34);
    auVar169._8_8_ = 0;
    auVar169._0_8_ = local_1c8;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_198;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = local_1d0;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = local_1d8;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = local_170;
    auVar3 = auVar173 * ZEXT816(0x851695d49a83) + auVar172 * ZEXT816(0xf8ef919bb8615) +
             auVar171 * ZEXT816(0x3cbcb16630fb6) + auVar170 * ZEXT816(0x8aed0a766a3ec) +
             (auVar2 >> 0x34);
    auVar174._8_8_ = 0;
    auVar174._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar2._6_2_ & 0xf);
    auVar4 = auVar169 * ZEXT816(0x693d68e6afa40) + auVar174 * ZEXT816(0x1000003d1);
    uVar497 = auVar4._0_8_;
    auVar470._8_8_ = 0;
    auVar470._0_8_ = auVar4._8_8_ * 0x1000 | uVar497 >> 0x34;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_170;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_1c8;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = local_198;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_1d0;
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_1d8;
    auVar3 = auVar179 * ZEXT816(0x851695d49a83) + auVar178 * ZEXT816(0xf8ef919bb8615) +
             auVar177 * ZEXT816(0x3cbcb16630fb6) + (auVar3 >> 0x34);
    uVar500 = auVar3._0_8_;
    auVar471._8_8_ = 0;
    auVar471._0_8_ = auVar3._8_8_ << 0xc | uVar500 >> 0x34;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = uVar500 & 0xfffffffffffff;
    auVar470 = auVar180 * ZEXT816(0x1000003d10) +
               auVar176 * ZEXT816(0x8aed0a766a3ec) + auVar175 * ZEXT816(0x693d68e6afa40) + auVar470;
    uVar500 = auVar470._0_8_;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = auVar470._8_8_ << 0xc | uVar500 >> 0x34;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_1d8;
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_170;
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_1c8;
    auVar184._8_8_ = 0;
    auVar184._0_8_ = local_198;
    auVar185._8_8_ = 0;
    auVar185._0_8_ = local_1d0;
    auVar471 = auVar185 * ZEXT816(0x851695d49a83) + auVar184 * ZEXT816(0xf8ef919bb8615) + auVar471;
    auVar186._8_8_ = 0;
    auVar186._0_8_ = auVar471._0_8_;
    auVar472 = auVar186 * ZEXT816(0x1000003d10) +
               auVar181 * ZEXT816(0x693d68e6afa40) +
               auVar183 * ZEXT816(0x3cbcb16630fb6) + auVar182 * ZEXT816(0x8aed0a766a3ec) + auVar472;
    auVar3 = auVar472 >> 0x34;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = auVar3._0_8_;
    auVar187._8_8_ = 0;
    auVar187._0_8_ = auVar471._8_8_;
    auVar473._8_8_ = auVar3._8_8_;
    auVar473._0_8_ = auVar1._0_8_ & 0xfffffffffffff;
    auVar474 = auVar187 * ZEXT816(0x1000003d10000) + auVar473 + auVar474;
    uVar503 = auVar474._0_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = uVar496;
    auVar189._8_8_ = 0;
    auVar189._0_8_ = uVar499;
    auVar190._8_8_ = 0;
    auVar190._0_8_ = uVar502;
    auVar191._8_8_ = 0;
    auVar191._0_8_ = uVar494;
    auVar192._8_8_ = 0;
    auVar192._0_8_ = uVar498;
    auVar193._8_8_ = 0;
    auVar193._0_8_ = SUB168(auVar192 * ZEXT816(0x7ae96a2b657c),0);
    auVar4 = auVar193 * ZEXT816(0x1000003d10) +
             auVar188 * ZEXT816(0x96c28719501ee) +
             auVar191 * ZEXT816(0x7106e64479ea) + auVar190 * ZEXT816(0xc3434e99cf049) +
             auVar189 * ZEXT816(0x7512f58995c13);
    auVar194._8_8_ = 0;
    auVar194._0_8_ = uVar498;
    auVar195._8_8_ = 0;
    auVar195._0_8_ = uVar496;
    auVar196._8_8_ = 0;
    auVar196._0_8_ = uVar499;
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar502;
    auVar198._8_8_ = 0;
    auVar198._0_8_ = uVar494;
    auVar199._8_8_ = 0;
    auVar199._0_8_ = SUB168(auVar192 * ZEXT816(0x7ae96a2b657c),8);
    auVar1 = auVar199 * ZEXT816(0x1000003d10000) +
             auVar194 * ZEXT816(0x96c28719501ee) +
             auVar195 * ZEXT816(0x7512f58995c13) +
             auVar196 * ZEXT816(0xc3434e99cf049) +
             auVar198 * ZEXT816(0x7ae96a2b657c) + auVar197 * ZEXT816(0x7106e64479ea) +
             (auVar4 >> 0x34);
    auVar200._8_8_ = 0;
    auVar200._0_8_ = uVar494;
    auVar201._8_8_ = 0;
    auVar201._0_8_ = uVar498;
    auVar202._8_8_ = 0;
    auVar202._0_8_ = uVar496;
    auVar203._8_8_ = 0;
    auVar203._0_8_ = uVar499;
    auVar204._8_8_ = 0;
    auVar204._0_8_ = uVar502;
    auVar3 = auVar202 * ZEXT816(0xc3434e99cf049) +
             auVar204 * ZEXT816(0x7ae96a2b657c) + auVar203 * ZEXT816(0x7106e64479ea) +
             auVar201 * ZEXT816(0x7512f58995c13) + (auVar1 >> 0x34);
    auVar205._8_8_ = 0;
    auVar205._0_8_ = (auVar3._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
    auVar5 = auVar200 * ZEXT816(0x96c28719501ee) + auVar205 * ZEXT816(0x1000003d1);
    uVar501 = auVar5._0_8_;
    auVar482._8_8_ = 0;
    auVar482._0_8_ = auVar5._8_8_ * 0x1000 | uVar501 >> 0x34;
    auVar206._8_8_ = 0;
    auVar206._0_8_ = uVar502;
    auVar207._8_8_ = 0;
    auVar207._0_8_ = uVar494;
    auVar208._8_8_ = 0;
    auVar208._0_8_ = uVar498;
    auVar209._8_8_ = 0;
    auVar209._0_8_ = uVar496;
    auVar210._8_8_ = 0;
    auVar210._0_8_ = uVar499;
    auVar3 = auVar208 * ZEXT816(0xc3434e99cf049) +
             auVar210 * ZEXT816(0x7ae96a2b657c) + auVar209 * ZEXT816(0x7106e64479ea) +
             (auVar3 >> 0x34);
    auVar211._8_8_ = 0;
    auVar211._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
    auVar482 = auVar211 * ZEXT816(0x1000003d10) +
               auVar207 * ZEXT816(0x7512f58995c13) + auVar206 * ZEXT816(0x96c28719501ee) + auVar482;
    uVar504 = auVar482._0_8_;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = auVar482._8_8_ * 0x1000 | uVar504 >> 0x34;
    auVar212._8_8_ = 0;
    auVar212._0_8_ = uVar499;
    auVar213._8_8_ = 0;
    auVar213._0_8_ = uVar502;
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar494;
    auVar215._8_8_ = 0;
    auVar215._0_8_ = uVar498;
    auVar216._8_8_ = 0;
    auVar216._0_8_ = uVar496;
    auVar3 = auVar216 * ZEXT816(0x7ae96a2b657c) + auVar215 * ZEXT816(0x7106e64479ea) +
             (auVar3 >> 0x34);
    auVar217._8_8_ = 0;
    auVar217._0_8_ = auVar3._0_8_;
    auVar475 = auVar217 * ZEXT816(0x1000003d10) +
               auVar212 * ZEXT816(0x96c28719501ee) +
               auVar214 * ZEXT816(0xc3434e99cf049) + auVar213 * ZEXT816(0x7512f58995c13) + auVar475;
    auVar5 = auVar475 >> 0x34;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = auVar5._0_8_;
    auVar218._8_8_ = 0;
    auVar218._0_8_ = auVar3._8_8_;
    auVar476._8_8_ = auVar5._8_8_;
    auVar476._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar477 = auVar218 * ZEXT816(0x1000003d10000) + auVar476 + auVar477;
    uVar494 = auVar477._0_8_;
    uVar502 = (uVar494 & 0xfffffffffffff) + (uVar503 & 0xfffffffffffff);
    uVar498 = (uVar501 & 0xfffffffffffff) + (uVar497 & 0xfffffffffffff);
    uVar501 = (uVar504 & 0xfffffffffffff) + (uVar500 & 0xfffffffffffff);
    uVar499 = (auVar475._0_8_ & 0xfffffffffffff) + (auVar472._0_8_ & 0xfffffffffffff);
    auVar219._8_8_ = 0;
    auVar219._0_8_ = uVar498;
    auVar401._8_8_ = 0;
    auVar401._0_8_ = uVar491;
    uVar496 = (auVar1._0_8_ & 0xffffffffffff) + (auVar2._0_8_ & 0xffffffffffff) +
              (auVar474._8_8_ << 0xc | uVar503 >> 0x34) + (auVar477._8_8_ << 0xc | uVar494 >> 0x34);
    auVar220._8_8_ = 0;
    auVar220._0_8_ = uVar501;
    auVar402._8_8_ = 0;
    auVar402._0_8_ = uVar490;
    auVar221._8_8_ = 0;
    auVar221._0_8_ = uVar499;
    auVar403._8_8_ = 0;
    auVar403._0_8_ = uVar489;
    auVar222._8_8_ = 0;
    auVar222._0_8_ = uVar502;
    auVar404._8_8_ = 0;
    auVar404._0_8_ = uVar488;
    auVar223._8_8_ = 0;
    auVar223._0_8_ = uVar496;
    auVar405._8_8_ = 0;
    auVar405._0_8_ = uVar492;
    auVar224._8_8_ = 0;
    auVar224._0_8_ = SUB168(auVar223 * auVar405,0);
    auVar4 = auVar220 * auVar402 + auVar219 * auVar401 + auVar221 * auVar403 + auVar222 * auVar404 +
             auVar224 * ZEXT816(0x1000003d10);
    auVar225._8_8_ = 0;
    auVar225._0_8_ = uVar498;
    auVar406._8_8_ = 0;
    auVar406._0_8_ = uVar492;
    auVar226._8_8_ = 0;
    auVar226._0_8_ = uVar501;
    auVar407._8_8_ = 0;
    auVar407._0_8_ = uVar491;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = uVar499;
    auVar408._8_8_ = 0;
    auVar408._0_8_ = uVar490;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = uVar502;
    auVar409._8_8_ = 0;
    auVar409._0_8_ = uVar489;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar496;
    auVar410._8_8_ = 0;
    auVar410._0_8_ = uVar488;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = SUB168(auVar223 * auVar405,8);
    auVar1 = auVar230 * ZEXT816(0x1000003d10000) +
             auVar229 * auVar410 +
             auVar228 * auVar409 + auVar227 * auVar408 + auVar226 * auVar407 + auVar225 * auVar406 +
             (auVar4 >> 0x34);
    auVar231._8_8_ = 0;
    auVar231._0_8_ = uVar498;
    auVar411._8_8_ = 0;
    auVar411._0_8_ = uVar488;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = uVar501;
    auVar412._8_8_ = 0;
    auVar412._0_8_ = uVar492;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar499;
    auVar413._8_8_ = 0;
    auVar413._0_8_ = uVar491;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar502;
    auVar414._8_8_ = 0;
    auVar414._0_8_ = uVar490;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = uVar496;
    auVar415._8_8_ = 0;
    auVar415._0_8_ = uVar489;
    auVar2 = auVar235 * auVar415 + auVar234 * auVar414 + auVar233 * auVar413 + auVar232 * auVar412 +
             (auVar1 >> 0x34);
    auVar236._8_8_ = 0;
    auVar236._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
    auVar3 = auVar236 * ZEXT816(0x1000003d1) + auVar231 * auVar411;
    uVar497 = auVar3._0_8_;
    uVar500 = auVar3._8_8_;
    uVar494 = uVar497 & 0xfffffffffffff;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar498;
    auVar416._8_8_ = 0;
    auVar416._0_8_ = uVar489;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar501;
    auVar417._8_8_ = 0;
    auVar417._0_8_ = uVar488;
    auVar454._8_8_ = uVar500 >> 0x34;
    auVar454._0_8_ = uVar500 * 0x1000 | uVar497 >> 0x34;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = uVar499;
    auVar418._8_8_ = 0;
    auVar418._0_8_ = uVar492;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = uVar502;
    auVar419._8_8_ = 0;
    auVar419._0_8_ = uVar491;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar496;
    auVar420._8_8_ = 0;
    auVar420._0_8_ = uVar490;
    auVar2 = auVar239 * auVar418 + auVar240 * auVar419 + auVar241 * auVar420 + (auVar2 >> 0x34);
    auVar242._8_8_ = 0;
    auVar242._0_8_ = auVar2._0_8_ & 0xfffffffffffff;
    auVar454 = auVar242 * ZEXT816(0x1000003d10) + auVar238 * auVar417 + auVar237 * auVar416 +
               auVar454;
    uVar500 = auVar454._0_8_ & 0xfffffffffffff;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar498;
    auVar421._8_8_ = 0;
    auVar421._0_8_ = uVar490;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar501;
    auVar422._8_8_ = 0;
    auVar422._0_8_ = uVar489;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar499;
    auVar423._8_8_ = 0;
    auVar423._0_8_ = uVar488;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar502;
    auVar424._8_8_ = 0;
    auVar424._0_8_ = uVar492;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar496;
    auVar425._8_8_ = 0;
    auVar425._0_8_ = uVar491;
    auVar2 = auVar247 * auVar425 + auVar246 * auVar424 + (auVar2 >> 0x34);
    auVar248._8_8_ = 0;
    auVar248._0_8_ = auVar2._0_8_;
    xd->n[4] = local_d0.n[4];
    xd->n[2] = local_d0.n[2];
    xd->n[3] = local_d0.n[3];
    xd->n[0] = local_d0.n[0];
    xd->n[1] = local_d0.n[1];
    auVar3 = auVar248 * ZEXT816(0x1000003d10) +
             auVar245 * auVar423 + auVar244 * auVar422 + auVar243 * auVar421 + (auVar454 >> 0x34);
    auVar5 = auVar3 >> 0x34;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = auVar5._0_8_;
    uVar499 = auVar3._0_8_ & 0xfffffffffffff;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = auVar2._8_8_;
    auVar478._8_8_ = auVar5._8_8_;
    auVar478._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
    auVar479 = auVar249 * ZEXT816(0x1000003d10000) + auVar478 + auVar479;
    uVar497 = auVar479._0_8_;
    uVar505 = (auVar479._8_8_ << 0xc | uVar497 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff);
    uVar497 = uVar497 & 0xfffffffffffff;
    local_f8.n[0] = uVar494;
    local_f8.n[1] = uVar500;
    local_f8.n[2] = uVar499;
    local_f8.n[3] = uVar497;
    local_f8.n[4] = uVar505;
    iVar493 = secp256k1_ge_x_frac_on_curve_var(&local_f8,&local_d0);
    if (iVar493 == 0) {
      auVar250._8_8_ = 0;
      auVar250._0_8_ = uVar483;
      auVar426._8_8_ = 0;
      auVar426._0_8_ = uVar491;
      auVar251._8_8_ = 0;
      auVar251._0_8_ = uVar484;
      auVar427._8_8_ = 0;
      auVar427._0_8_ = uVar490;
      auVar252._8_8_ = 0;
      auVar252._0_8_ = uVar485;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = uVar489;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = uVar486;
      auVar429._8_8_ = 0;
      auVar429._0_8_ = uVar488;
      auVar254._8_8_ = 0;
      auVar254._0_8_ = uVar487;
      auVar430._8_8_ = 0;
      auVar430._0_8_ = uVar492;
      auVar255._8_8_ = 0;
      auVar255._0_8_ = SUB168(auVar254 * auVar430,0);
      auVar3 = auVar251 * auVar427 + auVar250 * auVar426 + auVar252 * auVar428 + auVar253 * auVar429
               + auVar255 * ZEXT816(0x1000003d10);
      auVar256._8_8_ = 0;
      auVar256._0_8_ = uVar483;
      auVar431._8_8_ = 0;
      auVar431._0_8_ = uVar492;
      auVar257._8_8_ = 0;
      auVar257._0_8_ = uVar484;
      auVar432._8_8_ = 0;
      auVar432._0_8_ = uVar491;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = uVar485;
      auVar433._8_8_ = 0;
      auVar433._0_8_ = uVar490;
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uVar486;
      auVar434._8_8_ = 0;
      auVar434._0_8_ = uVar489;
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uVar487;
      auVar435._8_8_ = 0;
      auVar435._0_8_ = uVar488;
      auVar261._8_8_ = 0;
      auVar261._0_8_ = SUB168(auVar254 * auVar430,8);
      auVar1 = auVar261 * ZEXT816(0x1000003d10000) +
               auVar259 * auVar434 + auVar258 * auVar433 + auVar257 * auVar432 + auVar256 * auVar431
               + auVar260 * auVar435 + (auVar3 >> 0x34);
      auVar262._8_8_ = 0;
      auVar262._0_8_ = uVar483;
      auVar436._8_8_ = 0;
      auVar436._0_8_ = uVar488;
      auVar263._8_8_ = 0;
      auVar263._0_8_ = uVar484;
      auVar437._8_8_ = 0;
      auVar437._0_8_ = uVar492;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = uVar485;
      auVar438._8_8_ = 0;
      auVar438._0_8_ = uVar491;
      auVar265._8_8_ = 0;
      auVar265._0_8_ = uVar486;
      auVar439._8_8_ = 0;
      auVar439._0_8_ = uVar490;
      auVar266._8_8_ = 0;
      auVar266._0_8_ = uVar487;
      auVar440._8_8_ = 0;
      auVar440._0_8_ = uVar489;
      auVar2 = auVar266 * auVar440 + auVar265 * auVar439 + auVar264 * auVar438 + auVar263 * auVar437
               + (auVar1 >> 0x34);
      auVar267._8_8_ = 0;
      auVar267._0_8_ = (auVar2._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar1._6_2_ & 0xf);
      auVar4 = auVar262 * auVar436 + auVar267 * ZEXT816(0x1000003d1);
      uVar496 = auVar4._0_8_;
      uVar498 = auVar4._8_8_;
      auVar455._8_8_ = uVar498 >> 0x34;
      auVar455._0_8_ = uVar498 * 0x1000 | uVar496 >> 0x34;
      auVar268._8_8_ = 0;
      auVar268._0_8_ = uVar483;
      auVar441._8_8_ = 0;
      auVar441._0_8_ = uVar489;
      auVar269._8_8_ = 0;
      auVar269._0_8_ = uVar484;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = uVar488;
      auVar270._8_8_ = 0;
      auVar270._0_8_ = uVar485;
      auVar443._8_8_ = 0;
      auVar443._0_8_ = uVar492;
      auVar271._8_8_ = 0;
      auVar271._0_8_ = uVar486;
      auVar444._8_8_ = 0;
      auVar444._0_8_ = uVar491;
      auVar272._8_8_ = 0;
      auVar272._0_8_ = uVar487;
      auVar445._8_8_ = 0;
      auVar445._0_8_ = uVar490;
      auVar2 = auVar272 * auVar445 + auVar271 * auVar444 + auVar270 * auVar443 + (auVar2 >> 0x34);
      uVar501 = auVar2._0_8_;
      uVar498 = auVar2._8_8_;
      auVar273._8_8_ = 0;
      auVar273._0_8_ = uVar501 & 0xfffffffffffff;
      auVar455 = auVar273 * ZEXT816(0x1000003d10) + auVar268 * auVar441 + auVar269 * auVar442 +
                 auVar455;
      auVar456._8_8_ = uVar498 >> 0x34;
      auVar456._0_8_ = uVar498 * 0x1000 | uVar501 >> 0x34;
      auVar274._8_8_ = 0;
      auVar274._0_8_ = uVar483;
      auVar446._8_8_ = 0;
      auVar446._0_8_ = uVar490;
      auVar275._8_8_ = 0;
      auVar275._0_8_ = uVar484;
      auVar447._8_8_ = 0;
      auVar447._0_8_ = uVar489;
      auVar276._8_8_ = 0;
      auVar276._0_8_ = uVar485;
      auVar448._8_8_ = 0;
      auVar448._0_8_ = uVar488;
      auVar277._8_8_ = 0;
      auVar277._0_8_ = uVar486;
      auVar449._8_8_ = 0;
      auVar449._0_8_ = uVar492;
      auVar278._8_8_ = 0;
      auVar278._0_8_ = uVar487;
      auVar450._8_8_ = 0;
      auVar450._0_8_ = uVar491;
      auVar456 = auVar278 * auVar450 + auVar277 * auVar449 + auVar456;
      auVar279._8_8_ = 0;
      auVar279._0_8_ = auVar456._0_8_;
      auVar2 = auVar279 * ZEXT816(0x1000003d10) +
               auVar276 * auVar448 + auVar274 * auVar446 + auVar275 * auVar447 + (auVar455 >> 0x34);
      auVar4 = auVar2 >> 0x34;
      auVar481._8_8_ = 0;
      auVar481._0_8_ = auVar4._0_8_;
      auVar280._8_8_ = 0;
      auVar280._0_8_ = auVar456._8_8_;
      auVar480._8_8_ = auVar4._8_8_;
      auVar480._0_8_ = auVar3._0_8_ & 0xfffffffffffff;
      auVar481 = auVar280 * ZEXT816(0x1000003d10000) + auVar480 + auVar481;
      uVar498 = auVar481._0_8_;
      xn->n[0] = 0x5ffff9ffffe91a - (uVar494 + (uVar496 & 0xfffffffffffff));
      xn->n[1] = 0x5ffffffffffffa - (uVar500 + (auVar455._0_8_ & 0xfffffffffffff));
      xn->n[2] = 0x5ffffffffffffa - (uVar499 + (auVar2._0_8_ & 0xfffffffffffff));
      xn->n[3] = 0x5ffffffffffffa - (uVar497 + (uVar498 & 0xfffffffffffff));
      xn->n[4] = 0x5fffffffffffa -
                 ((auVar481._8_8_ << 0xc | uVar498 >> 0x34) + (auVar1._0_8_ & 0xffffffffffff) +
                 uVar505);
      return;
    }
    xn->n[4] = local_f8.n[4];
    xd = xn;
    local_58.n[0]._0_4_ = (undefined4)local_f8.n[0];
    local_58.n[0]._4_4_ = local_f8.n[0]._4_4_;
    local_58.n[1]._0_4_ = (undefined4)local_f8.n[1];
    local_58.n[1]._4_4_ = local_f8.n[1]._4_4_;
    local_58.n[2]._0_4_ = (undefined4)local_f8.n[2];
    local_58.n[2]._4_4_ = local_f8.n[2]._4_4_;
    local_58.n[3]._0_4_ = (undefined4)local_f8.n[3];
    local_58.n[3]._4_4_ = local_f8.n[3]._4_4_;
  }
  else {
    xn->n[4] = local_f8.n[4];
    xn->n[2] = local_f8.n[2];
    xn->n[3] = local_f8.n[3];
    xn->n[0] = local_f8.n[0];
    xn->n[1] = local_f8.n[1];
    xd->n[4] = local_58.n[4];
  }
  *(undefined4 *)(xd->n + 2) = (undefined4)local_58.n[2];
  *(undefined4 *)((long)xd->n + 0x14) = local_58.n[2]._4_4_;
  *(undefined4 *)(xd->n + 3) = (undefined4)local_58.n[3];
  *(undefined4 *)((long)xd->n + 0x1c) = local_58.n[3]._4_4_;
  *(undefined4 *)xd->n = (undefined4)local_58.n[0];
  *(undefined4 *)((long)xd->n + 4) = local_58.n[0]._4_4_;
  *(undefined4 *)(xd->n + 1) = (undefined4)local_58.n[1];
  *(undefined4 *)((long)xd->n + 0xc) = local_58.n[1]._4_4_;
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}